

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::tessellation::anon_unknown_0::InvariantOuterEdge::OuterEdgeIndexIndependenceTestInstance::
iterate(TestStatus *__return_storage_ptr__,OuterEdgeIndexIndependenceTestInstance *this)

{
  float *pfVar1;
  float fVar2;
  TessPrimitiveType TVar3;
  TestLog *pTVar4;
  undefined1 auVar5 [4];
  float fVar6;
  int i;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  _Rb_tree_node_base *p_Var11;
  long lVar12;
  char *pcVar13;
  size_t sVar14;
  byte bVar15;
  char *__s;
  ulong uVar16;
  _Rb_tree_node_base *p_Var17;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar18;
  pointer pOVar19;
  _Rb_tree_const_iterator<tcu::Vector<float,_3>_> __last1;
  int numIndentationSpaces;
  ulong uVar20;
  long lVar21;
  long lVar22;
  OuterEdgeDescription *edgeDesc;
  ulong uVar23;
  bool bVar24;
  bool bVar25;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar26;
  vector<float,_std::allocator<float>_> patchTessLevels;
  Vec3Set currentEdgeVertices;
  DrawResult result;
  Vec3Set firstEdgeVertices;
  undefined1 local_328 [4];
  float afStack_324 [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  float local_304;
  TestStatus *local_300;
  string local_2f8;
  vector<float,_std::allocator<float>_> local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c0;
  string *local_2b8;
  ulong local_2b0;
  float local_2a4;
  undefined1 local_2a0 [40];
  size_t local_278;
  long local_270;
  DrawResult local_268;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
  local_200;
  ulong local_1d0;
  BaseTestInstance *local_1c8;
  _Rb_tree_const_iterator<tcu::Vector<float,_3>_> local_1c0;
  _Base_ptr local_1b8;
  undefined1 local_1b0 [8];
  float local_1a8 [2];
  _Rb_tree_node<tcu::Vector<float,_3>_> local_1a0 [2];
  ios_base local_138 [264];
  
  local_2b8 = (string *)&__return_storage_ptr__->m_description;
  local_2c0 = &(__return_storage_ptr__->m_description).field_2;
  local_2b0 = 0;
  uVar23 = 0;
  __last1._M_node = (_Base_ptr)this;
  local_300 = __return_storage_ptr__;
  local_1c8 = &this->super_BaseTestInstance;
  do {
    local_200._M_t._M_impl._0_1_ = 0;
    local_200._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_200._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_200._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_200._M_t._M_impl.super__Rb_tree_header._M_header;
    local_200._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pOVar19 = (this->super_BaseTestInstance).m_edgeDescriptions.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar7 = (int)((ulong)((long)(this->super_BaseTestInstance).m_edgeDescriptions.
                                super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar19) >> 4);
    bVar25 = 0 < iVar7;
    local_200._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_200._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1d0 = uVar23;
    if (0 < iVar7) {
      local_304 = (float)(&tessellation::(anonymous_namespace)::InvariantOuterEdge::BaseTestInstance
                           ::m_singleOuterEdgeLevels)[local_2b0];
      local_270 = 8;
      uVar23 = 0;
      do {
        iVar7 = (int)uVar23;
        generatePatchTessLevels
                  (&local_2d8,(this->super_BaseTestInstance).m_numPatchesToDraw,iVar7,local_304);
        BaseTestInstance::uploadVertexAttributes(&this->super_BaseTestInstance,&local_2d8);
        edgeDesc = pOVar19 + uVar23;
        logOuterTessellationLevel
                  (((this->super_BaseTestInstance).super_TestInstance.m_context)->m_testCtx->m_log,
                   local_304,edgeDesc);
        bVar24 = (this->super_BaseTestInstance).m_caseDef.usePointMode;
        uVar20 = (ulong)bVar24;
        BaseTestInstance::draw
                  (&local_268,&this->super_BaseTestInstance,
                   (deUint32)
                   ((ulong)((long)local_2d8.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_2d8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start) >> 2),&local_2d8,
                   (this->super_BaseTestInstance).m_caseDef.winding,bVar24);
        lVar12 = local_270;
        numIndentationSpaces = (int)uVar20;
        if (local_268.success == false) {
          local_1b0 = (undefined1  [8])local_1a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b0,"Invalid set of vertices","");
          local_300->m_code = QP_TEST_RESULT_FAIL;
          (local_300->m_description)._M_dataplus._M_p = (pointer)local_2c0;
          __last1._M_node = (_Base_ptr)local_1b0;
          std::__cxx11::string::_M_construct<char*>
                    (local_2b8,local_1b0,
                     ((__aligned_membuf<tcu::Vector<float,_3>_> *)((long)local_1b0 + 0x20))->
                     _M_storage + CONCAT44(local_1a8[1],local_1a8[0]) + -0x20);
          if (local_1b0 != (undefined1  [8])local_1a0) {
            __last1._M_node = (_Base_ptr)(local_1a0[0].super__Rb_tree_node_base._0_8_ + 1);
            operator_delete((void *)local_1b0,(ulong)__last1._M_node);
          }
LAB_0079ba81:
          if (local_268.primitives.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            __last1._M_node =
                 (_Base_ptr)
                 ((long)local_268.primitives.
                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                 (long)local_268.primitives.
                       super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                       ._M_impl.super__Vector_impl_data._M_start);
            operator_delete(local_268.primitives.
                            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_start,(ulong)__last1._M_node);
          }
          if (local_2d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            __last1._M_node =
                 (_Base_ptr)
                 ((long)local_2d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                 (long)local_2d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start);
            operator_delete(local_2d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,(ulong)__last1._M_node);
          }
          std::
          _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
          ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)local_200._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                     (_Link_type)__last1._M_node);
          uVar18 = extraout_RDX_00;
          if (!bVar25) goto LAB_0079bacc;
          if ((local_1d0 & 1) == 0) {
            return local_300;
          }
          goto LAB_0079baf1;
        }
        local_2a0[0] = _S_red;
        local_2a0._8_4_ = _S_red;
        local_2a0._16_8_ = (_Base_ptr)0x0;
        local_2a0._24_8_ = local_2a0 + 8;
        local_278 = 0;
        local_2a0._32_8_ = local_2a0._24_8_;
        if (0 < local_268.numPrimitives) {
          lVar22 = 0;
          do {
            if (0 < local_268.numPrimitiveVertices) {
              lVar21 = 0;
              do {
                local_1b0._0_4_ =
                     local_268.primitives.
                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar22].tessCoord[lVar21].m_data[0];
                local_1b0._4_4_ =
                     local_268.primitives.
                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar22].tessCoord[lVar21].m_data[1];
                local_1a8[0] = local_268.primitives.
                               super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar22].tessCoord[lVar21].
                               m_data[2];
                uVar8 = (ulong)edgeDesc->numConstantCoordinateValueChoices;
                bVar24 = 0 < (long)uVar8;
                if ((long)uVar8 < 1) {
LAB_0079b290:
                  if (bVar24) goto LAB_0079b298;
                }
                else {
                  fVar2 = *(float *)(local_1b0 + (long)edgeDesc->constantCoordinateIndex * 4);
                  if ((fVar2 != edgeDesc->constantCoordinateValueChoices[0]) ||
                     (NAN(fVar2) || NAN(edgeDesc->constantCoordinateValueChoices[0]))) {
                    uVar10 = 1;
                    do {
                      uVar16 = uVar10;
                      if (uVar8 == uVar16) break;
                      pfVar1 = (float *)((long)pOVar19->constantCoordinateValueChoices +
                                        uVar16 * 4 + lVar12 + -8);
                      uVar10 = uVar16 + 1;
                    } while ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1)));
                    bVar24 = uVar16 < uVar8;
                    goto LAB_0079b290;
                  }
LAB_0079b298:
                  TVar3 = (this->super_BaseTestInstance).m_caseDef.primitiveType;
                  if (TVar3 == TESSPRIMITIVETYPE_QUADS) {
                    local_328 = (undefined1  [4])-1.0;
                    switch(uVar23 & 0xffffffff) {
                    case 0:
                    case 2:
                      local_328 = (undefined1  [4])local_1b0._4_4_;
                      break;
                    case 1:
                    case 3:
                      local_328 = (undefined1  [4])local_1b0._0_4_;
                    }
                    afStack_324[0] = 0.0;
                    afStack_324[1] = 0.0;
                    local_2a4 = (float)local_328;
                    pVar26 = std::
                             _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             ::_M_get_insert_unique_pos
                                       ((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                         *)local_2a0,(key_type *)local_328);
                    p_Var17 = pVar26.second;
                    if (p_Var17 != (_Rb_tree_node_base *)0x0) {
                      bVar24 = true;
                      if (((_Rb_tree_node_base *)(local_2a0 + 8) != p_Var17 &&
                           pVar26.first == (_Rb_tree_node_base *)0x0) &&
                         ((float)p_Var17[1]._M_color <= local_2a4)) {
                        if (local_2a4 <= (float)p_Var17[1]._M_color) {
                          uVar8 = 0;
                          do {
                            uVar10 = uVar8;
                            if (uVar10 == 2) {
                              uVar10 = 2;
                              bVar15 = 2;
                              goto LAB_0079b403;
                            }
                            if (afStack_324[uVar10] < *(float *)(&p_Var17[1].field_0x4 + uVar10 * 4)
                               ) {
                              bVar15 = 1;
                              goto LAB_0079b403;
                            }
                            uVar8 = uVar10 + 1;
                          } while (afStack_324[uVar10] <=
                                   *(float *)(&p_Var17[1].field_0x4 + uVar10 * 4));
                          bVar15 = 0;
LAB_0079b403:
                          bVar24 = (bool)(uVar10 < 2 & bVar15);
                        }
                        else {
                          bVar24 = false;
                        }
                      }
                      p_Var11 = (_Rb_tree_node_base *)operator_new(0x30);
                      *(float *)&p_Var11[1]._M_parent = afStack_324[1];
                      *(ulong *)(p_Var11 + 1) = CONCAT44(afStack_324[0],local_328);
                      std::_Rb_tree_insert_and_rebalance
                                (bVar24,p_Var11,p_Var17,(_Rb_tree_node_base *)(local_2a0 + 8));
                      local_278 = local_278 + 1;
                      this = (OuterEdgeIndexIndependenceTestInstance *)local_1c8;
                    }
                  }
                  else if (TVar3 == TESSPRIMITIVETYPE_TRIANGLES) {
                    auVar5 = (undefined1  [4])local_1b0._0_4_;
                    fVar2 = (float)local_1b0._4_4_;
                    fVar6 = local_1a8[0];
                    if (((iVar7 != 0) &&
                        (auVar5 = (undefined1  [4])local_1b0._4_4_, fVar2 = (float)local_1b0._0_4_,
                        iVar7 != 1)) &&
                       (auVar5 = (undefined1  [4])local_1a8[0], fVar2 = (float)local_1b0._4_4_,
                       fVar6 = (float)local_1b0._0_4_, iVar7 != 2)) {
                      lVar9 = 0;
                      do {
                        *(undefined4 *)(local_328 + lVar9 * 4) = 0xbf800000;
                        lVar9 = lVar9 + 1;
                        auVar5 = local_328;
                        fVar2 = afStack_324[0];
                        fVar6 = afStack_324[1];
                      } while (lVar9 != 3);
                    }
                    afStack_324[1] = fVar6;
                    afStack_324[0] = fVar2;
                    local_328 = auVar5;
                    std::
                    set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ::insert((set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)local_2a0,(value_type *)local_328);
                  }
                }
                lVar21 = lVar21 + 1;
              } while (lVar21 < local_268.numPrimitiveVertices);
            }
            numIndentationSpaces = (int)uVar20;
            lVar22 = lVar22 + 1;
          } while (lVar22 < local_268.numPrimitives);
        }
        __last1._M_node = (_Base_ptr)local_2a0;
        if (uVar23 != 0) {
          if (local_278 == local_200._M_t._M_impl.super__Rb_tree_header._M_node_count) {
            __last1._M_node = (_Base_ptr)(local_2a0 + 8);
            bVar24 = std::__equal<false>::
                     equal<std::_Rb_tree_const_iterator<tcu::Vector<float,3>>,std::_Rb_tree_const_iterator<tcu::Vector<float,3>>>
                               ((_Rb_tree_const_iterator<tcu::Vector<float,_3>_>)local_2a0._24_8_,
                                __last1,(_Rb_tree_const_iterator<tcu::Vector<float,_3>_>)
                                        local_200._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_left);
            if (bVar24) goto LAB_0079b4db;
          }
          TVar3 = (this->super_BaseTestInstance).m_caseDef.primitiveType;
          if (TVar3 == TESSPRIMITIVETYPE_QUADS) {
            __s = "(x, 0)";
            if (iVar7 != 1) {
              if (iVar7 != 2) {
                bVar24 = uVar23 == 3;
                pcVar13 = "(x, 0)";
                goto LAB_0079b670;
              }
              __s = "(y, 0)";
            }
          }
          else if (TVar3 == TESSPRIMITIVETYPE_TRIANGLES) {
            __s = "(y, x, z)";
            if (uVar23 != 1) {
              bVar24 = uVar23 == 2;
              pcVar13 = "(z, y, x)";
LAB_0079b670:
              __s = (char *)0x0;
              if (bVar24) {
                __s = pcVar13;
              }
            }
          }
          else {
            __s = (char *)0x0;
          }
          pTVar4 = ((this->super_BaseTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
          local_1b0 = (undefined1  [8])pTVar4;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Failure: the set of vertices on the ",0x24);
          tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                    ((string *)local_328,edgeDesc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)CONCAT44(afStack_324[0],local_328),
                     CONCAT44(afStack_324[2],afStack_324[1]));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," edge",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," doesn\'t match the set of vertices on the ",0x2a);
          tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                    (&local_2f8,
                     (this->super_BaseTestInstance).m_edgeDescriptions.
                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," edge",5);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(afStack_324[0],local_328) != &local_318) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(afStack_324[0],local_328),
                            local_318._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          local_1b0 = (undefined1  [8])pTVar4;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Note: set of vertices on ",0x19);
          tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                    ((string *)local_328,edgeDesc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)CONCAT44(afStack_324[0],local_328),
                     CONCAT44(afStack_324[2],afStack_324[1]));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," edge, components swizzled like ",0x20);
          if (__s == (char *)0x0) {
            std::ios::clear((int)(ostringstream *)local_1a8 +
                            (int)*(undefined8 *)(CONCAT44(local_1a8[1],local_1a8[0]) + -0x18));
          }
          else {
            sVar14 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar14);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," to match component order on first edge:\n",0x29);
          local_220._0_8_ = local_2a0._24_8_;
          local_240._0_8_ = local_2a0 + 8;
          elemsStr<std::_Rb_tree_const_iterator<tcu::Vector<float,3>>>
                    (&local_2f8,(tessellation *)local_220,
                     (_Rb_tree_const_iterator<tcu::Vector<float,_3>_> *)local_240,
                     (_Rb_tree_const_iterator<tcu::Vector<float,_3>_> *)0x5,0,numIndentationSpaces);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\non ",4);
          tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                    ((string *)local_220,
                     (this->super_BaseTestInstance).m_edgeDescriptions.
                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_220._0_8_,local_220._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," edge:\n",7);
          local_1b8 = local_200._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_1c0._M_node = &local_200._M_t._M_impl.super__Rb_tree_header._M_header;
          elemsStr<std::_Rb_tree_const_iterator<tcu::Vector<float,3>>>
                    ((string *)local_240,(tessellation *)&local_1b8,&local_1c0,
                     (_Rb_tree_const_iterator<tcu::Vector<float,_3>_> *)0x5,0,numIndentationSpaces);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_240._0_8_,local_240._8_8_);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((_Base_ptr)local_240._0_8_ != (_Base_ptr)(local_240 + 0x10)) {
            operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
          }
          if ((_Base_ptr)local_220._0_8_ != (_Base_ptr)(local_220 + 0x10)) {
            operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(afStack_324[0],local_328) != &local_318) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(afStack_324[0],local_328),
                            local_318._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          local_1b0 = (undefined1  [8])local_1a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b0,"Invalid set of vertices","");
          local_300->m_code = QP_TEST_RESULT_FAIL;
          (local_300->m_description)._M_dataplus._M_p = (pointer)local_2c0;
          __last1._M_node = (_Base_ptr)local_1b0;
          std::__cxx11::string::_M_construct<char*>
                    (local_2b8,local_1b0,
                     ((__aligned_membuf<tcu::Vector<float,_3>_> *)((long)local_1b0 + 0x20))->
                     _M_storage + CONCAT44(local_1a8[1],local_1a8[0]) + -0x20);
          if (local_1b0 != (undefined1  [8])local_1a0) {
            __last1._M_node = (_Base_ptr)(local_1a0[0].super__Rb_tree_node_base._0_8_ + 1);
            operator_delete((void *)local_1b0,(ulong)__last1._M_node);
          }
          std::
          _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
          ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)local_2a0._16_8_,(_Link_type)__last1._M_node);
          goto LAB_0079ba81;
        }
        std::
        set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ::operator=(&local_200,
                    (set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     *)__last1._M_node);
LAB_0079b4db:
        std::
        _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    *)local_2a0._16_8_,(_Link_type)__last1._M_node);
        if (local_268.primitives.
            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          __last1._M_node =
               (_Base_ptr)
               ((long)local_268.primitives.
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)local_268.primitives.
                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          operator_delete(local_268.primitives.
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                          ._M_impl.super__Vector_impl_data._M_start,(ulong)__last1._M_node);
        }
        if (local_2d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          __last1._M_node =
               (_Base_ptr)
               ((long)local_2d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage -
               (long)local_2d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start);
          operator_delete(local_2d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,(ulong)__last1._M_node);
        }
        uVar23 = uVar23 + 1;
        pOVar19 = (this->super_BaseTestInstance).m_edgeDescriptions.
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar12 = (long)(int)((ulong)((long)(this->super_BaseTestInstance).m_edgeDescriptions.
                                           super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)pOVar19) >> 4);
        local_270 = local_270 + 0x10;
        bVar25 = (long)uVar23 < lVar12;
      } while ((long)uVar23 < lVar12);
    }
    std::
    _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
    ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                *)local_200._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
               (_Link_type)__last1._M_node);
    uVar18 = extraout_RDX;
LAB_0079bacc:
    bVar25 = 10 < local_2b0;
    local_2b0 = local_2b0 + 1;
    uVar23 = CONCAT71((int7)((ulong)uVar18 >> 8),bVar25);
  } while (local_2b0 != 0xc);
LAB_0079baf1:
  local_1b0 = (undefined1  [8])local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"OK","");
  local_300->m_code = QP_TEST_RESULT_PASS;
  (local_300->m_description)._M_dataplus._M_p = (pointer)local_2c0;
  std::__cxx11::string::_M_construct<char*>
            (local_2b8,local_1b0,
             (long)&((_Rb_tree_node_base *)local_1b0)->_M_color +
             CONCAT44(local_1a8[1],local_1a8[0]));
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0].super__Rb_tree_node_base._0_8_ + 1);
  }
  return local_300;
}

Assistant:

tcu::TestStatus OuterEdgeIndexIndependenceTestInstance::iterate (void)
{
	for (int outerEdgeLevelCaseNdx = 0; outerEdgeLevelCaseNdx < DE_LENGTH_OF_ARRAY(m_singleOuterEdgeLevels); ++outerEdgeLevelCaseNdx)
	{
		Vec3Set firstEdgeVertices;

		for (int outerEdgeIndex = 0; outerEdgeIndex < static_cast<int>(m_edgeDescriptions.size()); ++outerEdgeIndex)
		{
			const OuterEdgeDescription& edgeDesc        = m_edgeDescriptions[outerEdgeIndex];
			const std::vector<float>    patchTessLevels = generatePatchTessLevels(m_numPatchesToDraw, outerEdgeIndex, m_singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);

			uploadVertexAttributes(patchTessLevels);
			logOuterTessellationLevel(m_context.getTestContext().getLog(), m_singleOuterEdgeLevels[outerEdgeLevelCaseNdx], edgeDesc);
			const DrawResult result = draw(static_cast<deUint32>(patchTessLevels.size()), patchTessLevels, m_caseDef.winding, m_caseDef.usePointMode);

			// Verify case result

			if (!result.success)
				return tcu::TestStatus::fail("Invalid set of vertices");

			Vec3Set currentEdgeVertices;

			// Get the vertices on the current outer edge.
			for (int primitiveNdx = 0; primitiveNdx < result.numPrimitives; ++primitiveNdx)
			for (int i = 0; i < result.numPrimitiveVertices; ++i)
			{
				const tcu::Vec3& coord = result.primitives[primitiveNdx].tessCoord[i].swizzle(0, 1, 2);
				if (edgeDesc.contains(coord))
				{
					// Swizzle components to match the order of the first edge.
					if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
						currentEdgeVertices.insert(outerEdgeIndex == 0 ? coord :
												   outerEdgeIndex == 1 ? coord.swizzle(1, 0, 2) :
												   outerEdgeIndex == 2 ? coord.swizzle(2, 1, 0) : tcu::Vec3(-1.0f));
					else if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS)
						currentEdgeVertices.insert(tcu::Vec3(outerEdgeIndex == 0 ? coord.y() :
															 outerEdgeIndex == 1 ? coord.x() :
															 outerEdgeIndex == 2 ? coord.y() :
															 outerEdgeIndex == 3 ? coord.x() : -1.0f,
															 0.0f, 0.0f));
					else
						DE_ASSERT(false);
				}
			}

			if (outerEdgeIndex == 0)
				firstEdgeVertices = currentEdgeVertices;
			else
			{
				// Compare vertices of this edge to those of the first edge.
				if (currentEdgeVertices != firstEdgeVertices)
				{
					const char* const swizzleDesc =
						m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? (outerEdgeIndex == 1 ? "(y, x, z)" :
																				  outerEdgeIndex == 2 ? "(z, y, x)" : DE_NULL) :
						m_caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS ? (outerEdgeIndex == 1 ? "(x, 0)" :
																			  outerEdgeIndex == 2 ? "(y, 0)" :
																			  outerEdgeIndex == 3 ? "(x, 0)" : DE_NULL)
						: DE_NULL;

					tcu::TestLog& log = m_context.getTestContext().getLog();
					log << tcu::TestLog::Message
						<< "Failure: the set of vertices on the " << edgeDesc.description() << " edge"
						<< " doesn't match the set of vertices on the " << m_edgeDescriptions[0].description() << " edge"
						<< tcu::TestLog::EndMessage;

					log << tcu::TestLog::Message
						<< "Note: set of vertices on " << edgeDesc.description() << " edge, components swizzled like " << swizzleDesc
						<< " to match component order on first edge:\n" << containerStr(currentEdgeVertices, 5)
						<< "\non " << m_edgeDescriptions[0].description() << " edge:\n" << containerStr(firstEdgeVertices, 5)
						<< tcu::TestLog::EndMessage;

					return tcu::TestStatus::fail("Invalid set of vertices");
				}
			}
		}
	}
	return tcu::TestStatus::pass("OK");
}